

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gcfinal.c
# Opt level: O3

LispPTR linkblock(LispPTR base)

{
  ulong uVar1;
  DLword *pDVar2;
  DLword *pDVar3;
  DLword *pDVar4;
  uint uVar5;
  LispPTR onfreelist;
  uint uVar6;
  int iVar7;
  uint uVar8;
  LispPTR *pLVar9;
  
  uVar1 = (ulong)base;
  if (*FreeBlockBuckets_word != 0) {
    if ((base & 1) != 0) {
      printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",uVar1);
    }
    pDVar2 = Lisp_world;
    uVar5 = (uint)Lisp_world[uVar1];
    onfreelist = 0;
    uVar8 = (uint)Lisp_world[uVar1];
    if (3 < uVar8) {
      uVar6 = 0;
      do {
        uVar8 = uVar8 >> 1;
        uVar6 = uVar6 + 1;
      } while (uVar8 != 1);
      iVar7 = 0x3c;
      if (uVar6 < 0x1e) {
        iVar7 = 2;
        do {
          uVar5 = uVar5 >> 1;
          iVar7 = iVar7 + 2;
        } while (uVar5 != 1);
      }
      uVar8 = iVar7 + *FreeBlockBuckets_word & 0xfffffff;
      if ((*FreeBlockBuckets_word & 1) != 0) {
        printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",(ulong)uVar8);
      }
      pDVar3 = Lisp_world;
      uVar5 = *(uint *)(Lisp_world + uVar8) & 0xfffffff;
      if (uVar5 == 0) {
        *(LispPTR *)(pDVar2 + uVar1 + 2) = base;
        pLVar9 = (LispPTR *)(pDVar2 + uVar1 + 4);
      }
      else {
        if ((*(uint *)(Lisp_world + uVar8) & 1) != 0) {
          printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",(ulong)uVar5);
        }
        pDVar4 = Lisp_world;
        *(uint *)(pDVar2 + uVar1 + 2) = uVar5;
        uVar6 = *(uint *)(pDVar4 + (ulong)uVar5 + 4);
        *(uint *)(pDVar2 + uVar1 + 4) = uVar6;
        if ((uVar6 & 1) != 0) {
          printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",(ulong)uVar6);
        }
        pLVar9 = (LispPTR *)(pDVar4 + (ulong)uVar5 + 4);
        *(LispPTR *)(Lisp_world + (ulong)uVar6 + 2) = base;
      }
      *pLVar9 = base;
      *(LispPTR *)(pDVar3 + uVar8) = base;
      onfreelist = 1;
    }
    checkarrayblock(base,1,onfreelist);
  }
  return base;
}

Assistant:

LispPTR linkblock(LispPTR base) {
  struct arrayblock *bbase, *fbbase, *tmpbase;
  LispPTR fbl, freeblocklsp;
  LispPTR *freeblock;
  if (*FreeBlockBuckets_word != NIL) {
    bbase = (struct arrayblock *)NativeAligned4FromLAddr(base);
    if (bbase->arlen < MINARRAYBLOCKSIZE)
      checkarrayblock(base, T, NIL);
    else {
      fbl = FreeBlockChainN(bbase->arlen);
      freeblock = (LispPTR *)NativeAligned4FromLAddr(POINTERMASK & fbl);
      freeblocklsp = POINTERMASK & (*freeblock);
      if (freeblocklsp == NIL) {
        bbase->fwd = base;
        bbase->bkwd = base;
      } else {
        fbbase = (struct arrayblock *)NativeAligned4FromLAddr(freeblocklsp);
        bbase->fwd = freeblocklsp;
        bbase->bkwd = fbbase->bkwd;
        tmpbase = (struct arrayblock *)NativeAligned4FromLAddr(fbbase->bkwd);
        tmpbase->fwd = base;
        fbbase->bkwd = base;
      }
      *freeblock = base;
      checkarrayblock(base, T, T);
    }
  }
  return (base);
}